

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  int *piVar1;
  ulong uVar2;
  long *in_RSI;
  Mat *in_RDI;
  bool bVar3;
  Option opt_q;
  Mat weight_data_int8;
  Mat weight_data_r2;
  int num_input;
  int maxk;
  Option *in_stack_fffffffffffff8a0;
  bool local_711;
  size_t *in_stack_fffffffffffff938;
  size_t *psVar4;
  undefined8 in_stack_fffffffffffff940;
  Mat *pMVar5;
  int _w;
  Mat *in_stack_fffffffffffff948;
  Option *in_stack_fffffffffffff9a8;
  Mat *scale_data;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  Mat *src;
  Mat *in_stack_fffffffffffff9c8;
  long *local_620;
  void *local_5b0;
  int *local_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  long *local_590;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  int local_578;
  long local_570;
  void *local_568;
  int *local_560;
  long *local_548;
  undefined4 local_520;
  int local_51c;
  void *local_518;
  int *local_510;
  undefined8 local_508;
  undefined4 local_500;
  long *local_4f8;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined8 local_4d8;
  Allocator local_4d0;
  int *local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  long *local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined8 local_490;
  Mat local_488;
  void *local_440;
  int *local_438;
  undefined8 local_430;
  undefined4 local_428;
  long *local_420;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined8 local_400;
  Mat local_3e8;
  long *local_3a0;
  int local_38c;
  void **local_388;
  Mat *local_380;
  void **local_370;
  Mat *local_360;
  Allocator *local_350;
  void **local_340;
  undefined1 *local_330;
  void **local_320;
  void **local_310;
  undefined4 local_300;
  undefined4 local_2fc;
  size_t *local_2f8;
  size_t *local_2f0;
  size_t *local_2e8;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  size_t *local_2d0;
  size_t *local_2c8;
  int local_2c0;
  undefined4 local_2bc;
  Allocator *local_2b8;
  size_t *local_2b0;
  size_t *local_2a8;
  int local_2a0;
  undefined4 local_29c;
  Mat *local_298;
  size_t *local_290;
  size_t *local_288;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  size_t *local_270;
  size_t *local_268;
  int local_260;
  undefined4 local_25c;
  Mat *local_258;
  size_t *local_250;
  Mat *local_248;
  void **local_240;
  size_t *local_238;
  size_t *local_230;
  int local_228;
  undefined4 local_224;
  size_t *local_220;
  int local_218;
  undefined4 local_214;
  size_t *local_210;
  int local_208;
  undefined4 local_204;
  size_t *local_200;
  int local_1f8;
  undefined4 local_1f4;
  size_t *local_1f0;
  int local_1e8;
  undefined4 local_1e4;
  size_t *local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  size_t *local_1d0;
  int local_1b8;
  undefined4 local_1b4;
  void **local_1b0;
  int local_198;
  undefined4 local_194;
  void **local_190;
  int local_178;
  undefined4 local_174;
  undefined1 *local_170;
  int local_158;
  undefined4 local_154;
  void **local_150;
  int local_138;
  undefined4 local_134;
  Allocator *local_130;
  int local_118;
  undefined4 local_114;
  Mat *local_110;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  int local_d8;
  undefined4 local_d4;
  Mat *local_d0;
  void *local_68;
  void *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  size_t *local_18;
  size_t *local_10;
  void **local_8;
  
  _w = (int)((ulong)in_stack_fffffffffffff940 >> 0x20);
  src = (Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0);
  if (in_RDI[4].c == 0) {
    local_3a0 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(&local_3e8,in_RSI,in_RDI[3].w,0);
    scale_data = (Mat *)&in_RDI[4].cstep;
    local_258 = &local_3e8;
    local_250 = (size_t *)scale_data;
    if (scale_data != local_258) {
      if (local_3e8.refcount != (int *)0x0) {
        local_25c = 1;
        LOCK();
        local_260 = *local_3e8.refcount;
        *local_3e8.refcount = *local_3e8.refcount + 1;
        UNLOCK();
      }
      pMVar5 = scale_data;
      local_220 = (size_t *)scale_data;
      if (in_RDI[5].data != (void *)0x0) {
        piVar1 = (int *)in_RDI[5].data;
        local_224 = 0xffffffff;
        LOCK();
        local_228 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_228 == 1) {
          if (*(long *)&in_RDI[5].elempack == 0) {
            local_20 = *(void **)scale_data;
            if (local_20 != (void *)0x0) {
              free(local_20);
            }
          }
          else {
            (**(code **)(**(long **)&in_RDI[5].elempack + 0x18))
                      (*(long **)&in_RDI[5].elempack,*(size_t *)scale_data);
          }
        }
      }
      ((Option *)scale_data)->lightmode = false;
      ((Option *)scale_data)->use_shader_pack8 = false;
      ((Option *)scale_data)->use_subgroup_ops = false;
      ((Option *)scale_data)->use_reserved_0 = false;
      ((Option *)scale_data)->num_threads = 0;
      ((Option *)scale_data)->workspace_allocator = (Allocator *)0x0;
      ((Option *)scale_data)->openmp_blocktime = 0;
      ((Option *)scale_data)->vulkan_device_index = 0;
      ((Option *)scale_data)->use_reserved_1 = false;
      ((Option *)scale_data)->use_image_storage = false;
      ((Option *)scale_data)->use_tensor_storage = false;
      ((Option *)scale_data)->use_reserved_2 = false;
      ((Option *)scale_data)->flush_denormals = 0;
      ((Option *)scale_data)->use_local_pool_allocator = false;
      ((Option *)scale_data)->use_shader_local_memory = false;
      ((Option *)scale_data)->use_cooperative_matrix = false;
      ((Option *)scale_data)->use_winograd23_convolution = false;
      ((Option *)scale_data)->use_winograd43_convolution = false;
      ((Option *)scale_data)->use_winograd63_convolution = false;
      ((Option *)scale_data)->use_a53_a55_optimized_kernel = false;
      ((Option *)scale_data)->use_fp16_uniform = false;
      ((Option *)((long)scale_data + 0x40))->lightmode = false;
      ((Option *)((long)scale_data + 0x40))->use_shader_pack8 = false;
      ((Option *)((long)scale_data + 0x40))->use_subgroup_ops = false;
      ((Option *)((long)scale_data + 0x40))->use_reserved_0 = false;
      ((Option *)((long)scale_data + 0x40))->num_threads = 0;
      ((Option *)scale_data)->blob_allocator = (Allocator *)0x0;
      pMVar5->data = local_258->data;
      pMVar5->refcount = local_258->refcount;
      pMVar5->elemsize = local_258->elemsize;
      pMVar5->elempack = local_258->elempack;
      pMVar5->allocator = local_258->allocator;
      pMVar5->dims = local_258->dims;
      pMVar5->w = local_258->w;
      pMVar5->h = local_258->h;
      pMVar5->d = local_258->d;
      pMVar5->c = local_258->c;
      pMVar5->cstep = local_258->cstep;
      in_stack_fffffffffffff9a8 = (Option *)scale_data;
      scale_data = pMVar5;
    }
    local_380 = &local_3e8;
    local_248 = scale_data;
    local_d0 = local_380;
    if (local_3e8.refcount != (int *)0x0) {
      local_d4 = 0xffffffff;
      LOCK();
      local_d8 = *local_3e8.refcount;
      *local_3e8.refcount = *local_3e8.refcount + -1;
      UNLOCK();
      if (local_d8 == 1) {
        if (local_3e8.allocator == (Allocator *)0x0) {
          if (local_3e8.data != (void *)0x0) {
            free(local_3e8.data);
          }
        }
        else {
          (*(local_3e8.allocator)->_vptr_Allocator[3])(local_3e8.allocator,local_3e8.data);
        }
      }
    }
    local_3e8.data = (void *)0x0;
    local_3e8.elemsize = 0;
    local_3e8.elempack = 0;
    local_3e8.dims = 0;
    local_3e8.w = 0;
    local_3e8.h = 0;
    local_3e8.d = 0;
    local_3e8.c = 0;
    local_3e8.cstep = 0;
    local_3e8.refcount = (int *)0x0;
    local_230 = &in_RDI[4].cstep;
    bVar3 = true;
    if (*local_230 != 0) {
      bVar3 = *(long *)&in_RDI[5].c * (long)in_RDI[5].h == 0;
      local_18 = local_230;
    }
    if (bVar3) {
      local_38c = -100;
    }
    else {
      if (in_RDI[3].dims != 0) {
        (**(code **)(*local_3a0 + 0x10))(&local_440,local_3a0,(int)in_RDI[2].cstep,1);
        psVar4 = &in_RDI[5].cstep;
        local_278 = &local_440;
        local_270 = psVar4;
        if ((void **)psVar4 != local_278) {
          if (local_438 != (int *)0x0) {
            local_27c = 1;
            LOCK();
            local_280 = *local_438;
            *local_438 = *local_438 + 1;
            UNLOCK();
          }
          pMVar5 = in_RDI;
          local_210 = psVar4;
          if (in_RDI[6].data != (void *)0x0) {
            piVar1 = (int *)in_RDI[6].data;
            local_214 = 0xffffffff;
            LOCK();
            local_218 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_218 == 1) {
              if (*(long *)&in_RDI[6].elempack == 0) {
                local_28 = (void *)*psVar4;
                if (local_28 != (void *)0x0) {
                  free(local_28);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI[6].elempack + 0x18))
                          (*(long **)&in_RDI[6].elempack,*psVar4);
              }
            }
          }
          *psVar4 = 0;
          in_RDI[6].refcount = (int *)0x0;
          *(undefined4 *)&in_RDI[6].elemsize = 0;
          *(undefined4 *)&in_RDI[6].allocator = 0;
          *(undefined4 *)((long)&in_RDI[6].allocator + 4) = 0;
          in_RDI[6].dims = 0;
          in_RDI[6].w = 0;
          in_RDI[6].h = 0;
          *(undefined8 *)&in_RDI[6].c = 0;
          in_RDI[6].data = (void *)0x0;
          *psVar4 = (size_t)*local_278;
          in_RDI[6].data = local_278[1];
          in_RDI[6].refcount = (int *)local_278[2];
          *(undefined4 *)&in_RDI[6].elemsize = *(undefined4 *)(local_278 + 3);
          *(void **)&in_RDI[6].elempack = local_278[4];
          *(undefined4 *)&in_RDI[6].allocator = *(undefined4 *)(local_278 + 5);
          *(undefined4 *)((long)&in_RDI[6].allocator + 4) = *(undefined4 *)((long)local_278 + 0x2c);
          in_RDI[6].dims = *(int *)(local_278 + 6);
          in_RDI[6].w = *(int *)((long)local_278 + 0x34);
          in_RDI[6].h = *(int *)(local_278 + 7);
          *(void **)&in_RDI[6].c = local_278[8];
          in_RDI = pMVar5;
        }
        local_370 = &local_440;
        local_268 = psVar4;
        local_f0 = local_370;
        if (local_438 != (int *)0x0) {
          local_f4 = 0xffffffff;
          LOCK();
          local_f8 = *local_438;
          *local_438 = *local_438 + -1;
          UNLOCK();
          if (local_f8 == 1) {
            if (local_420 == (long *)0x0) {
              if (local_440 != (void *)0x0) {
                free(local_440);
              }
            }
            else {
              (**(code **)(*local_420 + 0x18))(local_420,local_440);
            }
          }
        }
        local_440 = (void *)0x0;
        local_430 = 0;
        local_428 = 0;
        local_418 = 0;
        local_414 = 0;
        local_410 = 0;
        local_40c = 0;
        local_408 = 0;
        local_400 = 0;
        local_438 = (int *)0x0;
        local_238 = &in_RDI[5].cstep;
        bVar3 = true;
        if (*local_238 != 0) {
          bVar3 = *(long *)&in_RDI[6].c * (long)in_RDI[6].h == 0;
          local_10 = local_238;
        }
        if (bVar3) {
          return -100;
        }
      }
      if (in_RDI[3].h != 0) {
        (**(code **)(*local_3a0 + 0x10))(&local_488,local_3a0,(int)in_RDI[2].cstep,1);
        psVar4 = &in_RDI[6].cstep;
        local_298 = &local_488;
        local_290 = psVar4;
        if ((Mat *)psVar4 != local_298) {
          if (local_488.refcount != (int *)0x0) {
            local_29c = 1;
            LOCK();
            local_2a0 = *local_488.refcount;
            *local_488.refcount = *local_488.refcount + 1;
            UNLOCK();
          }
          in_stack_fffffffffffff948 = (Mat *)psVar4;
          pMVar5 = in_RDI;
          local_200 = psVar4;
          if (in_RDI[7].data != (void *)0x0) {
            piVar1 = (int *)in_RDI[7].data;
            local_204 = 0xffffffff;
            LOCK();
            local_208 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_208 == 1) {
              if (*(long *)&in_RDI[7].elempack == 0) {
                local_30 = (void *)*psVar4;
                if (local_30 != (void *)0x0) {
                  free(local_30);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI[7].elempack + 0x18))
                          (*(long **)&in_RDI[7].elempack,*psVar4);
              }
            }
          }
          in_stack_fffffffffffff948->data = (void *)0x0;
          in_stack_fffffffffffff948->elemsize = 0;
          in_stack_fffffffffffff948->elempack = 0;
          in_stack_fffffffffffff948->dims = 0;
          in_stack_fffffffffffff948->w = 0;
          in_stack_fffffffffffff948->h = 0;
          in_stack_fffffffffffff948->d = 0;
          in_stack_fffffffffffff948->c = 0;
          in_stack_fffffffffffff948->cstep = 0;
          in_stack_fffffffffffff948->refcount = (int *)0x0;
          *psVar4 = (size_t)local_298->data;
          in_RDI[7].data = local_298->refcount;
          in_RDI[7].refcount = (int *)local_298->elemsize;
          *(int *)&in_RDI[7].elemsize = local_298->elempack;
          *(Allocator **)&in_RDI[7].elempack = local_298->allocator;
          *(int *)&in_RDI[7].allocator = local_298->dims;
          *(int *)((long)&in_RDI[7].allocator + 4) = local_298->w;
          in_RDI[7].dims = local_298->h;
          in_RDI[7].w = local_298->d;
          in_RDI[7].h = local_298->c;
          *(size_t *)&in_RDI[7].c = local_298->cstep;
          in_RDI = pMVar5;
        }
        pMVar5 = &local_488;
        local_360 = pMVar5;
        local_288 = psVar4;
        local_110 = pMVar5;
        if (local_488.refcount != (int *)0x0) {
          local_114 = 0xffffffff;
          LOCK();
          local_118 = *local_488.refcount;
          *local_488.refcount = *local_488.refcount + -1;
          UNLOCK();
          if (local_118 == 1) {
            if (local_488.allocator == (Allocator *)0x0) {
              if (local_488.data != (void *)0x0) {
                free(local_488.data);
              }
            }
            else {
              (*(local_488.allocator)->_vptr_Allocator[3])(local_488.allocator,local_488.data);
            }
          }
        }
        pMVar5->data = (void *)0x0;
        pMVar5->elemsize = 0;
        pMVar5->elempack = 0;
        pMVar5->dims = 0;
        pMVar5->w = 0;
        pMVar5->h = 0;
        pMVar5->d = 0;
        pMVar5->c = 0;
        pMVar5->cstep = 0;
        pMVar5->refcount = (int *)0x0;
        (**(code **)(*local_3a0 + 0x10))(&local_4d0,local_3a0,1);
        _w = (int)((ulong)pMVar5 >> 0x20);
        in_stack_fffffffffffff938 = &in_RDI[7].cstep;
        local_2b8 = &local_4d0;
        local_2b0 = in_stack_fffffffffffff938;
        if ((Allocator *)in_stack_fffffffffffff938 != local_2b8) {
          if (local_4c8 != (int *)0x0) {
            local_2bc = 1;
            LOCK();
            local_2c0 = *local_4c8;
            *local_4c8 = *local_4c8 + 1;
            UNLOCK();
          }
          psVar4 = in_stack_fffffffffffff938;
          pMVar5 = in_RDI;
          local_1f0 = in_stack_fffffffffffff938;
          if (in_RDI[8].data != (void *)0x0) {
            piVar1 = (int *)in_RDI[8].data;
            local_1f4 = 0xffffffff;
            LOCK();
            local_1f8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_1f8 == 1) {
              if (*(long *)&in_RDI[8].elempack == 0) {
                local_38 = (void *)*in_stack_fffffffffffff938;
                if (local_38 != (void *)0x0) {
                  free(local_38);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI[8].elempack + 0x18))
                          (*(long **)&in_RDI[8].elempack,*in_stack_fffffffffffff938);
              }
            }
          }
          *in_stack_fffffffffffff938 = 0;
          in_RDI[8].refcount = (int *)0x0;
          *(undefined4 *)&in_RDI[8].elemsize = 0;
          *(undefined4 *)&in_RDI[8].allocator = 0;
          *(undefined4 *)((long)&in_RDI[8].allocator + 4) = 0;
          in_RDI[8].dims = 0;
          in_RDI[8].w = 0;
          in_RDI[8].h = 0;
          *(undefined8 *)&in_RDI[8].c = 0;
          in_RDI[8].data = (void *)0x0;
          *psVar4 = (size_t)local_2b8->_vptr_Allocator;
          ((Allocator *)(psVar4 + 1))->_vptr_Allocator = local_2b8[1]._vptr_Allocator;
          ((Allocator *)(psVar4 + 2))->_vptr_Allocator = local_2b8[2]._vptr_Allocator;
          *(undefined4 *)&((Allocator *)(psVar4 + 3))->_vptr_Allocator =
               *(undefined4 *)&local_2b8[3]._vptr_Allocator;
          ((Allocator *)(psVar4 + 4))->_vptr_Allocator = local_2b8[4]._vptr_Allocator;
          *(undefined4 *)&((Allocator *)(psVar4 + 5))->_vptr_Allocator =
               *(undefined4 *)&local_2b8[5]._vptr_Allocator;
          *(undefined4 *)((long)psVar4 + 0x2c) =
               *(undefined4 *)((long)&local_2b8[5]._vptr_Allocator + 4);
          *(undefined4 *)&((Allocator *)(psVar4 + 6))->_vptr_Allocator =
               *(undefined4 *)&local_2b8[6]._vptr_Allocator;
          *(undefined4 *)((long)psVar4 + 0x34) =
               *(undefined4 *)((long)&local_2b8[6]._vptr_Allocator + 4);
          *(undefined4 *)&((Allocator *)(psVar4 + 7))->_vptr_Allocator =
               *(undefined4 *)&local_2b8[7]._vptr_Allocator;
          ((Allocator *)(psVar4 + 8))->_vptr_Allocator = local_2b8[8]._vptr_Allocator;
          in_stack_fffffffffffff938 = psVar4;
          in_RDI = pMVar5;
        }
        local_350 = &local_4d0;
        local_2a8 = in_stack_fffffffffffff938;
        local_130 = local_350;
        if (local_4c8 != (int *)0x0) {
          local_134 = 0xffffffff;
          LOCK();
          local_138 = *local_4c8;
          *local_4c8 = *local_4c8 + -1;
          UNLOCK();
          if (local_138 == 1) {
            if (local_4b0 == (long *)0x0) {
              if (local_4d0._vptr_Allocator != (_func_int **)0x0) {
                free(local_4d0._vptr_Allocator);
              }
            }
            else {
              (**(code **)(*local_4b0 + 0x18))(local_4b0,local_4d0._vptr_Allocator);
            }
          }
        }
        local_4d0._vptr_Allocator = (_func_int **)0x0;
        local_4c0 = 0;
        local_4b8 = 0;
        local_4a8 = 0;
        local_4a4 = 0;
        local_4a0 = 0;
        local_49c = 0;
        local_498 = 0;
        local_490 = 0;
        local_4c8 = (int *)0x0;
      }
      if (100 < in_RDI[3].h) {
        (**(code **)(*local_3a0 + 0x10))(&local_518,local_3a0,1);
        psVar4 = &in_RDI[8].cstep;
        local_2d8 = &local_518;
        local_2d0 = psVar4;
        if ((void **)psVar4 != local_2d8) {
          if (local_510 != (int *)0x0) {
            local_2dc = 1;
            LOCK();
            local_2e0 = *local_510;
            *local_510 = *local_510 + 1;
            UNLOCK();
          }
          pMVar5 = in_RDI;
          local_1e0 = psVar4;
          if (in_RDI[9].data != (void *)0x0) {
            piVar1 = (int *)in_RDI[9].data;
            local_1e4 = 0xffffffff;
            LOCK();
            local_1e8 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_1e8 == 1) {
              if (*(long *)&in_RDI[9].elempack == 0) {
                local_40 = (void *)*psVar4;
                if (local_40 != (void *)0x0) {
                  free(local_40);
                }
              }
              else {
                (**(code **)(**(long **)&in_RDI[9].elempack + 0x18))
                          (*(long **)&in_RDI[9].elempack,*psVar4);
              }
            }
          }
          *psVar4 = 0;
          in_RDI[9].refcount = (int *)0x0;
          *(undefined4 *)&in_RDI[9].elemsize = 0;
          *(undefined4 *)&in_RDI[9].allocator = 0;
          *(undefined4 *)((long)&in_RDI[9].allocator + 4) = 0;
          in_RDI[9].dims = 0;
          in_RDI[9].w = 0;
          in_RDI[9].h = 0;
          *(undefined8 *)&in_RDI[9].c = 0;
          in_RDI[9].data = (void *)0x0;
          *psVar4 = (size_t)*local_2d8;
          in_RDI[9].data = local_2d8[1];
          in_RDI[9].refcount = (int *)local_2d8[2];
          *(undefined4 *)&in_RDI[9].elemsize = *(undefined4 *)(local_2d8 + 3);
          *(void **)&in_RDI[9].elempack = local_2d8[4];
          *(undefined4 *)&in_RDI[9].allocator = *(undefined4 *)(local_2d8 + 5);
          *(undefined4 *)((long)&in_RDI[9].allocator + 4) = *(undefined4 *)((long)local_2d8 + 0x2c);
          in_RDI[9].dims = *(int *)(local_2d8 + 6);
          in_RDI[9].w = *(int *)((long)local_2d8 + 0x34);
          in_RDI[9].h = *(int *)(local_2d8 + 7);
          *(void **)&in_RDI[9].c = local_2d8[8];
          in_RDI = pMVar5;
        }
        local_340 = &local_518;
        local_2c8 = psVar4;
        local_150 = local_340;
        if (local_510 != (int *)0x0) {
          local_154 = 0xffffffff;
          LOCK();
          local_158 = *local_510;
          *local_510 = *local_510 + -1;
          UNLOCK();
          if (local_158 == 1) {
            if (local_4f8 == (long *)0x0) {
              if (local_518 != (void *)0x0) {
                free(local_518);
              }
            }
            else {
              (**(code **)(*local_4f8 + 0x18))(local_4f8,local_518);
            }
          }
        }
        local_518 = (void *)0x0;
        local_508 = 0;
        local_500 = 0;
        local_4f0 = 0;
        local_4ec = 0;
        local_4e8 = 0;
        local_4e4 = 0;
        local_4e0 = 0;
        local_4d8 = 0;
        local_510 = (int *)0x0;
      }
      if ((in_RDI[5].refcount == (int *)0x4) && (in_RDI[3].h != 0)) {
        local_51c = *(int *)((long)&in_RDI[2].cstep + 4) * *(int *)&in_RDI[3].data;
        uVar2 = (long)in_RDI[3].w / (long)(int)in_RDI[2].cstep;
        local_520 = (undefined4)
                    ((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                    (long)local_51c);
        Mat::reshape(in_stack_fffffffffffff9c8,(int)((ulong)src >> 0x20),(int)src,
                     (int)((ulong)in_RDI >> 0x20),(Allocator *)scale_data);
        local_388 = &local_5b0;
        local_5b0 = (void *)0x0;
        local_5a8 = (int *)0x0;
        local_5a0 = 0;
        local_598 = 0;
        local_590 = (long *)0x0;
        local_588 = 0;
        local_584 = 0;
        local_580 = 0;
        local_57c = 0;
        local_578 = 0;
        local_570 = 0;
        Option::Option(in_stack_fffffffffffff8a0);
        quantize_to_int8(src,in_RDI,scale_data,in_stack_fffffffffffff9a8);
        local_240 = &local_5b0;
        if (local_5b0 != (void *)0x0) {
          local_8 = local_240;
        }
        local_711 = local_5b0 != (void *)0x0 && local_570 * local_578 != 0;
        if (local_711) {
          Mat::reshape(in_stack_fffffffffffff948,_w,(Allocator *)in_stack_fffffffffffff938);
          psVar4 = &in_RDI[4].cstep;
          local_2f8 = (size_t *)&stack0xfffffffffffff9c0;
          local_2f0 = psVar4;
          if (psVar4 != local_2f8) {
            if (in_stack_fffffffffffff9c8 != (Mat *)0x0) {
              local_2fc = 1;
              LOCK();
              local_300 = *(undefined4 *)&in_stack_fffffffffffff9c8->data;
              *(int *)&in_stack_fffffffffffff9c8->data =
                   *(int *)&in_stack_fffffffffffff9c8->data + 1;
              UNLOCK();
            }
            local_1d0 = psVar4;
            if (in_RDI[5].data != (void *)0x0) {
              piVar1 = (int *)in_RDI[5].data;
              local_1d4 = 0xffffffff;
              LOCK();
              local_1d8 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_1d8 == 1) {
                if (*(long *)&in_RDI[5].elempack == 0) {
                  local_48 = (void *)*psVar4;
                  if (local_48 != (void *)0x0) {
                    free(local_48);
                  }
                }
                else {
                  (**(code **)(**(long **)&in_RDI[5].elempack + 0x18))
                            (*(long **)&in_RDI[5].elempack,*psVar4);
                }
              }
            }
            *psVar4 = 0;
            in_RDI[5].refcount = (int *)0x0;
            *(undefined4 *)&in_RDI[5].elemsize = 0;
            *(undefined4 *)&in_RDI[5].allocator = 0;
            *(undefined4 *)((long)&in_RDI[5].allocator + 4) = 0;
            in_RDI[5].dims = 0;
            in_RDI[5].w = 0;
            in_RDI[5].h = 0;
            *(undefined8 *)&in_RDI[5].c = 0;
            in_RDI[5].data = (void *)0x0;
            *psVar4 = *local_2f8;
            in_RDI[5].data = (void *)local_2f8[1];
            in_RDI[5].refcount = (int *)local_2f8[2];
            *(int *)&in_RDI[5].elemsize = (int)local_2f8[3];
            *(size_t *)&in_RDI[5].elempack = local_2f8[4];
            *(int *)&in_RDI[5].allocator = (int)local_2f8[5];
            *(undefined4 *)((long)&in_RDI[5].allocator + 4) =
                 *(undefined4 *)((long)local_2f8 + 0x2c);
            in_RDI[5].dims = (int)local_2f8[6];
            in_RDI[5].w = *(int *)((long)local_2f8 + 0x34);
            in_RDI[5].h = (int)local_2f8[7];
            *(size_t *)&in_RDI[5].c = local_2f8[8];
          }
          local_330 = &stack0xfffffffffffff9c0;
          local_2e8 = psVar4;
          local_170 = local_330;
          if (in_stack_fffffffffffff9c8 != (Mat *)0x0) {
            local_174 = 0xffffffff;
            LOCK();
            local_178 = *(int *)&in_stack_fffffffffffff9c8->data;
            *(int *)&in_stack_fffffffffffff9c8->data = *(int *)&in_stack_fffffffffffff9c8->data + -1
            ;
            UNLOCK();
            if (local_178 == 1) {
              if (local_620 == (long *)0x0) {
                if (src != (Mat *)0x0) {
                  free(src);
                }
              }
              else {
                (**(code **)(*local_620 + 0x18))(local_620,src);
              }
            }
          }
          bVar3 = false;
        }
        else {
          local_38c = -100;
          bVar3 = true;
        }
        local_320 = &local_5b0;
        local_190 = local_320;
        if (local_5a8 != (int *)0x0) {
          local_194 = 0xffffffff;
          LOCK();
          local_198 = *local_5a8;
          *local_5a8 = *local_5a8 + -1;
          UNLOCK();
          if (local_198 == 1) {
            if (local_590 == (long *)0x0) {
              local_68 = local_5b0;
              if (local_5b0 != (void *)0x0) {
                free(local_5b0);
              }
            }
            else {
              (**(code **)(*local_590 + 0x18))(local_590,local_5b0);
            }
          }
        }
        local_5b0 = (void *)0x0;
        local_5a0 = 0;
        local_598 = 0;
        local_588 = 0;
        local_584 = 0;
        local_580 = 0;
        local_57c = 0;
        local_578 = 0;
        local_570 = 0;
        local_5a8 = (int *)0x0;
        local_310 = &local_568;
        if (local_560 != (int *)0x0) {
          local_1b4 = 0xffffffff;
          LOCK();
          local_1b8 = *local_560;
          *local_560 = *local_560 + -1;
          UNLOCK();
          if (local_1b8 == 1) {
            local_1b0 = local_310;
            if (local_548 == (long *)0x0) {
              if (local_568 != (void *)0x0) {
                free(local_568);
              }
            }
            else {
              (**(code **)(*local_548 + 0x18))(local_548,local_568);
            }
          }
        }
        if (bVar3) {
          return local_38c;
        }
      }
      local_38c = 0;
    }
  }
  else {
    local_38c = 0;
  }
  return local_38c;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q;
        opt_q.num_threads = 1;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}